

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> * __thiscall
duckdb::QueryGraphEdges::GetConnections
          (vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> *__return_storage_ptr__,
          QueryGraphEdges *this,JoinRelationSet *node,JoinRelationSet *other)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = ::std::
             _Function_handler<bool_(duckdb::NeighborInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/query_graph.cpp:131:27)>
             ::_M_invoke;
  local_20 = ::std::
             _Function_handler<bool_(duckdb::NeighborInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/join_order/query_graph.cpp:131:27)>
             ::_M_manager;
  local_30._M_unused._M_object = other;
  local_30._8_8_ = __return_storage_ptr__;
  EnumerateNeighbors(this,node,(function<bool_(duckdb::NeighborInfo_&)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<reference<NeighborInfo>> QueryGraphEdges::GetConnections(JoinRelationSet &node,
                                                                      JoinRelationSet &other) const {
	vector<reference<NeighborInfo>> connections;
	EnumerateNeighbors(node, [&](NeighborInfo &info) -> bool {
		if (JoinRelationSet::IsSubset(other, *info.neighbor)) {
			connections.push_back(info);
		}
		return false;
	});
	return connections;
}